

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void LoadFunction(LoadState *S,Proto *f)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  Instruction *b;
  TValue *pTVar3;
  Proto **ppPVar4;
  Proto *pPVar5;
  Upvaldesc *pUVar6;
  TString *pTVar7;
  int *b_00;
  LocVar *pLVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar1 = LoadInt(S);
  f->linedefined = iVar1;
  iVar1 = LoadInt(S);
  f->lastlinedefined = iVar1;
  iVar1 = LoadChar(S);
  f->numparams = (lu_byte)iVar1;
  iVar1 = LoadChar(S);
  f->is_vararg = (lu_byte)iVar1;
  iVar1 = LoadChar(S);
  f->maxstacksize = (lu_byte)iVar1;
  uVar2 = LoadInt(S);
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,(ulong)uVar2 << 2);
  f->code = b;
  f->sizecode = uVar2;
  LoadBlock(S,b,(ulong)uVar2 << 2);
  uVar2 = LoadInt(S);
  sVar12 = (ulong)uVar2 << 4;
  pTVar3 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,sVar12);
  f->k = pTVar3;
  f->sizek = uVar2;
  for (sVar9 = 0; sVar12 != sVar9; sVar9 = sVar9 + 0x10) {
    *(undefined4 *)((long)&pTVar3->tt_ + sVar9) = 0;
  }
  sVar9 = 0;
  do {
    if (sVar12 == sVar9) {
      uVar2 = LoadInt(S);
      uVar13 = (ulong)uVar2;
      ppPVar4 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,uVar13 * 8);
      f->p = ppPVar4;
      f->sizep = uVar2;
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        f->p[uVar10] = (Proto *)0x0;
      }
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        pPVar5 = luaF_newproto(S->L);
        f->p[uVar10] = pPVar5;
        LoadFunction(S,f->p[uVar10]);
      }
      uVar2 = LoadInt(S);
      sVar12 = (ulong)uVar2 << 4;
      pUVar6 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar12);
      f->upvalues = pUVar6;
      f->sizeupvalues = uVar2;
      for (sVar9 = 0; sVar12 != sVar9; sVar9 = sVar9 + 0x10) {
        *(undefined8 *)((long)&pUVar6->name + sVar9) = 0;
      }
      for (sVar9 = 0; sVar12 != sVar9; sVar9 = sVar9 + 0x10) {
        iVar1 = LoadChar(S);
        (&f->upvalues->instack)[sVar9] = (lu_byte)iVar1;
        iVar1 = LoadChar(S);
        (&f->upvalues->idx)[sVar9] = (lu_byte)iVar1;
      }
      pTVar7 = LoadString(S);
      f->source = pTVar7;
      uVar2 = LoadInt(S);
      b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,(ulong)uVar2 << 2);
      f->lineinfo = b_00;
      f->sizelineinfo = uVar2;
      LoadBlock(S,b_00,(ulong)uVar2 << 2);
      uVar2 = LoadInt(S);
      sVar12 = (ulong)uVar2 << 4;
      pLVar8 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar12);
      f->locvars = pLVar8;
      f->sizelocvars = uVar2;
      for (sVar9 = 0; sVar12 != sVar9; sVar9 = sVar9 + 0x10) {
        *(undefined8 *)((long)&pLVar8->varname + sVar9) = 0;
      }
      for (sVar9 = 0; sVar12 != sVar9; sVar9 = sVar9 + 0x10) {
        pTVar7 = LoadString(S);
        *(TString **)((long)&f->locvars->varname + sVar9) = pTVar7;
        iVar1 = LoadInt(S);
        *(int *)((long)&f->locvars->startpc + sVar9) = iVar1;
        iVar1 = LoadInt(S);
        *(int *)((long)&f->locvars->endpc + sVar9) = iVar1;
      }
      uVar2 = LoadInt(S);
      for (lVar11 = 0; (ulong)uVar2 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
        pTVar7 = LoadString(S);
        *(TString **)((long)&f->upvalues->name + lVar11) = pTVar7;
      }
      return;
    }
    pTVar3 = f->k;
    uVar2 = LoadChar(S);
    switch(uVar2) {
    case 0:
      break;
    case 1:
      iVar1 = LoadChar(S);
      *(int *)((long)&pTVar3->value_ + sVar9) = iVar1;
      uVar2 = 1;
      break;
    default:
      goto switchD_0010fedc_caseD_2;
    case 3:
      LoadBlock(S,&local_38,8);
      *(undefined8 *)((long)&pTVar3->value_ + sVar9) = local_38;
      uVar2 = 3;
      break;
    case 4:
      pTVar7 = LoadString(S);
      *(TString **)((long)&pTVar3->value_ + sVar9) = pTVar7;
      uVar2 = (pTVar7->tsv).tt | 0x40;
    }
    *(uint *)((long)&pTVar3->tt_ + sVar9) = uVar2;
switchD_0010fedc_caseD_2:
    sVar9 = sVar9 + 0x10;
  } while( true );
}

Assistant:

static void LoadFunction(LoadState* S, Proto* f)
{
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadUpvalues(S,f);
 LoadDebug(S,f);
}